

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

Environment * iutest::TestEnv::ReleaseGlobalTestEnvironment(Environment *env)

{
  iterator this;
  bool bVar1;
  const_iterator local_48;
  __normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
  local_40;
  Environment **local_38;
  __normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
  local_30;
  __normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
  local_28;
  iterator it;
  iuEnvironmentList *list;
  Environment *env_local;
  
  if (env == (Environment *)0x0) {
    env_local = (Environment *)0x0;
  }
  else {
    list = (iuEnvironmentList *)env;
    it._M_current = (Environment **)environments();
    local_30._M_current =
         (Environment **)
         std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::begin
                   ((vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_> *)
                    it._M_current);
    local_38 = (Environment **)
               std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::end
                         (it._M_current);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<iutest::Environment**,std::vector<iutest::Environment*,std::allocator<iutest::Environment*>>>,iutest::Environment*>
                         (local_30,(__normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
                                    )local_38,(Environment **)&list);
    local_40._M_current =
         (Environment **)
         std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::end
                   (it._M_current);
    bVar1 = __gnu_cxx::operator==(&local_28,&local_40);
    this = it;
    if (bVar1) {
      env_local = (Environment *)0x0;
    }
    else {
      __gnu_cxx::
      __normal_iterator<iutest::Environment*const*,std::vector<iutest::Environment*,std::allocator<iutest::Environment*>>>
      ::__normal_iterator<iutest::Environment**>
                ((__normal_iterator<iutest::Environment*const*,std::vector<iutest::Environment*,std::allocator<iutest::Environment*>>>
                  *)&local_48,&local_28);
      std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::erase
                ((vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_> *)
                 this._M_current,local_48);
      env_local = (Environment *)list;
    }
  }
  return env_local;
}

Assistant:

static Environment* ReleaseGlobalTestEnvironment(Environment* env)
    {
        if( env == NULL )
        {
            return NULL;
        }
        iuEnvironmentList& list = environments();
        iuEnvironmentList::iterator it = ::std::find(list.begin(), list.end(), env);
        if( it == list.end() )
        {
            return NULL;
        }
        list.erase(it);
        return env;
    }